

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fetch.hpp
# Opt level: O3

void __thiscall
TI::TMS::SMSFetcher<(TI::TMS::Personality)3>::fetch_tile_name
          (SMSFetcher<(TI::TMS::Personality)3> *this,int column)

{
  long lVar1;
  byte bVar2;
  RowInfo *pRVar3;
  
  pRVar3 = &this->static_row_info;
  if (column < 0x18) {
    pRVar3 = &this->scrolled_row_info;
  }
  lVar1 = (ulong)pRVar3->pattern_address_base + (ulong)(column - this->horizontal_offset & 0x1f) * 2
  ;
  bVar2 = (this->base->ram_)._M_elems[lVar1 + 1];
  (this->base->fetch_line_buffer_->field_5).bitmap[column] = bVar2;
  this->base->tile_offset_ =
       (bVar2 & 1) * 0x2000 + pRVar3->sub_row[bVar2 >> 2 & 1] +
       (ushort)(this->base->ram_)._M_elems[lVar1] * 0x20;
  return;
}

Assistant:

void fetch_tile_name(int column) {
		const RowInfo &row_info = column < 24 ? scrolled_row_info : static_row_info;
		const size_t scrolled_column = (column - horizontal_offset) & 0x1f;
		const size_t address = row_info.pattern_address_base + (scrolled_column << 1);
		auto &line_buffer = *base->fetch_line_buffer_;

		line_buffer.tiles.flags[column] = base->ram_[address+1];
		base->tile_offset_ = AddressT(
			(((line_buffer.tiles.flags[column]&1) << 8) | base->ram_[address]) << 5
		) + row_info.sub_row[(line_buffer.tiles.flags[column]&4) >> 2];
	}